

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall glslang::TParseContext::variableCheck(TParseContext *this,TIntermTyped **nodePtr)

{
  TIntermediate *this_00;
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  long lVar4;
  TSourceLoc *pTVar5;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar6;
  undefined8 uVar7;
  TPoolAllocator *this_01;
  TVariable *this_02;
  TString *name;
  TIntermSymbol *pTVar8;
  TType local_c8;
  long *plVar2;
  
  iVar1 = (*((*nodePtr)->super_TIntermNode)._vptr_TIntermNode[0xc])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    plVar3 = (long *)(**(code **)(*plVar2 + 0xf0))(plVar2);
    iVar1 = (**(code **)(*plVar3 + 0x38))(plVar3);
    if (iVar1 == 0) {
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan != 0) {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*plVar2 + 400))(plVar2);
        iVar1 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (pbVar6,"gl_VertexID");
        if ((iVar1 != 0) &&
           ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan != 0)) {
          pbVar6 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   (**(code **)(*plVar2 + 400))(plVar2);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(pbVar6,"gl_InstanceID");
        }
      }
      uVar7 = (**(code **)*plVar2)(plVar2);
      lVar4 = (**(code **)(*plVar2 + 400))(plVar2);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,uVar7,"undeclared identifier",*(undefined8 *)(lVar4 + 8));
      lVar4 = (**(code **)(*plVar2 + 400))(plVar2);
      if (*(long *)(lVar4 + 0x10) != 0) {
        this_01 = GetThreadPoolAllocator();
        this_02 = (TVariable *)TPoolAllocator::allocate(this_01,0xf8);
        name = (TString *)(**(code **)(*plVar2 + 400))(plVar2);
        TType::TType(&local_c8,EbtFloat,EvqTemporary,1,0,0,false);
        TVariable::TVariable(this_02,name,name,&local_c8,false);
        TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_02);
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar5 = (TSourceLoc *)(**(code **)*plVar2)(plVar2);
        pTVar8 = TIntermediate::addSymbol(this_00,this_02,pTVar5);
        *nodePtr = &pTVar8->super_TIntermTyped;
      }
    }
    else {
      lVar4 = (**(code **)(*plVar2 + 0x108))(plVar2);
      if ((*(uint *)(lVar4 + 8) & 0x7f) == 0x1b) {
        pTVar5 = (TSourceLoc *)(**(code **)*plVar2)(plVar2);
        TParseVersions::profileRequires
                  ((TParseVersions *)this,pTVar5,1,0x78,(char *)0x0,"gl_PointCoord");
        return;
      }
    }
  }
  return;
}

Assistant:

void TParseContext::variableCheck(TIntermTyped*& nodePtr)
{
    TIntermSymbol* symbol = nodePtr->getAsSymbolNode();
    if (! symbol)
        return;

    if (symbol->getType().getBasicType() == EbtVoid) {
        const char *extraInfoFormat = "";
        if (spvVersion.vulkan != 0 && symbol->getName() == "gl_VertexID") {
          extraInfoFormat = "(Did you mean gl_VertexIndex?)";
        } else if (spvVersion.vulkan != 0 && symbol->getName() == "gl_InstanceID") {
          extraInfoFormat = "(Did you mean gl_InstanceIndex?)";
        }
        error(symbol->getLoc(), "undeclared identifier", symbol->getName().c_str(), extraInfoFormat);

        // Add to symbol table to prevent future error messages on the same name
        if (symbol->getName().size() > 0) {
            TVariable* fakeVariable = new TVariable(&symbol->getName(), TType(EbtFloat));
            symbolTable.insert(*fakeVariable);

            // substitute a symbol node for this new variable
            nodePtr = intermediate.addSymbol(*fakeVariable, symbol->getLoc());
        }
    } else {
        switch (symbol->getQualifier().storage) {
        case EvqPointCoord:
            profileRequires(symbol->getLoc(), ENoProfile, 120, nullptr, "gl_PointCoord");
            break;
        default: break; // some compilers want this
        }
    }
}